

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

_Bool proxy_for_destination(SockAddr *addr,char *hostname,int port,Conf *conf)

{
  byte bVar1;
  ushort *puVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  ushort **ppuVar7;
  long lVar8;
  long lVar9;
  undefined4 in_register_00000014;
  Conf *conf_00;
  size_t __n;
  long lVar10;
  long lVar11;
  byte *pbVar12;
  char *__s1;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  char hostip [64];
  char local_78 [72];
  
  conf_00 = (Conf *)CONCAT44(in_register_00000014,port);
  if (addr == (SockAddr *)0x0) {
    _Var3 = conf_get_bool(conf_00,0xc);
    if ((!_Var3) && (_Var3 = sk_hostname_is_local(hostname), _Var3)) {
      return false;
    }
    lVar10 = 0;
  }
  else {
    _Var3 = sk_address_is_special_local(addr);
    if ((_Var3) ||
       ((_Var3 = conf_get_bool(conf_00,0xc), !_Var3 &&
        ((_Var3 = sk_hostname_is_local(hostname), _Var3 ||
         (_Var3 = sk_address_is_local(addr), _Var3)))))) {
      return false;
    }
    sk_getaddr(addr,local_78,0x40);
    sVar5 = strlen(local_78);
    lVar10 = (long)(int)sVar5;
  }
  sVar5 = strlen(hostname);
  pbVar6 = (byte *)conf_get_str(conf_00,10);
  bVar17 = *pbVar6;
  if (bVar17 != 0) {
    ppuVar7 = __ctype_b_loc();
    puVar2 = *ppuVar7;
    uVar15 = 0;
    do {
      lVar11 = (long)(int)uVar15;
      lVar8 = lVar11 << 0x20;
      lVar13 = 0;
      while ((bVar17 == 0x2c || ((puVar2[bVar17] & 0x2000) != 0))) {
        bVar17 = pbVar6[lVar13 + lVar11 + 1];
        lVar13 = lVar13 + 1;
        lVar8 = lVar8 + 0x100000000;
        if (bVar17 == 0) {
          return true;
        }
      }
      uVar16 = (ulong)uVar15 + lVar13;
      bVar1 = pbVar6[lVar8 >> 0x20];
      lVar9 = lVar11 + lVar13;
      lVar8 = lVar8 >> 0x20;
      while ((iVar14 = (int)uVar16, bVar1 != 0 &&
             (((puVar2[bVar1] & 8) != 0 ||
              ((lVar8 = lVar9, bVar1 < 0x2f && ((0x640000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)
               )))))) {
        uVar16 = (ulong)(iVar14 + 1);
        bVar1 = pbVar6[lVar9 + 1];
        lVar9 = lVar9 + 1;
        lVar8 = lVar9;
      }
      iVar4 = (int)lVar13;
      if (bVar17 == 0x2a) {
        __n = (size_t)(int)((~uVar15 + iVar14) - iVar4);
        if ((addr != (SockAddr *)0x0) &&
           (iVar4 = strncasecmp(local_78 + -__n + lVar10,(char *)(pbVar6 + lVar13 + lVar11 + 1),__n)
           , iVar4 == 0)) {
          return false;
        }
        pbVar12 = pbVar6 + lVar13 + lVar11 + 1;
        __s1 = hostname + -__n + (long)(int)sVar5;
      }
      else {
        pbVar12 = pbVar6 + lVar11 + lVar13;
        if (pbVar6[lVar8 + -1] == 0x2a) {
          iVar4 = (~uVar15 + iVar14) - iVar4;
        }
        else {
          iVar4 = (iVar14 - uVar15) - iVar4;
        }
        __n = (size_t)iVar4;
        __s1 = hostname;
        if ((addr != (SockAddr *)0x0) &&
           (iVar4 = strncasecmp(local_78,(char *)pbVar12,__n), iVar4 == 0)) {
          return false;
        }
      }
      iVar4 = strncasecmp(__s1,(char *)pbVar12,__n);
      if (iVar4 == 0) {
        return false;
      }
      bVar17 = pbVar6[iVar14];
      if (bVar17 == 0) {
        return true;
      }
      pbVar12 = pbVar6 + (long)iVar14 + 1;
      do {
        uVar15 = (uint)uVar16;
        if ((bVar17 == 0x2c) || ((puVar2[bVar17] & 0x2000) != 0)) break;
        uVar15 = uVar15 + 1;
        uVar16 = (ulong)uVar15;
        bVar17 = *pbVar12;
        pbVar12 = pbVar12 + 1;
      } while (bVar17 != 0);
      bVar17 = pbVar6[(int)uVar15];
    } while (bVar17 != 0);
  }
  return true;
}

Assistant:

static bool proxy_for_destination(SockAddr *addr, const char *hostname,
                                  int port, Conf *conf)
{
    int s = 0, e = 0;
    char hostip[64];
    int hostip_len, hostname_len;
    const char *exclude_list;

    /*
     * Special local connections such as Unix-domain sockets
     * unconditionally cannot be proxied, even in proxy-localhost
     * mode. There just isn't any way to ask any known proxy type for
     * them.
     */
    if (addr && sk_address_is_special_local(addr))
        return false;                  /* do not proxy */

    /*
     * Check the host name and IP against the hard-coded
     * representations of `localhost'.
     */
    if (!conf_get_bool(conf, CONF_even_proxy_localhost) &&
        (sk_hostname_is_local(hostname) ||
         (addr && sk_address_is_local(addr))))
        return false;                  /* do not proxy */

    /* we want a string representation of the IP address for comparisons */
    if (addr) {
        sk_getaddr(addr, hostip, 64);
        hostip_len = strlen(hostip);
    } else
        hostip_len = 0;                /* placate gcc; shouldn't be required */

    hostname_len = strlen(hostname);

    exclude_list = conf_get_str(conf, CONF_proxy_exclude_list);

    /* now parse the exclude list, and see if either our IP
     * or hostname matches anything in it.
     */

    while (exclude_list[s]) {
        while (exclude_list[s] &&
               (isspace((unsigned char)exclude_list[s]) ||
                exclude_list[s] == ',')) s++;

        if (!exclude_list[s]) break;

        e = s;

        while (exclude_list[e] &&
               (isalnum((unsigned char)exclude_list[e]) ||
                exclude_list[e] == '-' ||
                exclude_list[e] == '.' ||
                exclude_list[e] == '*')) e++;

        if (exclude_list[s] == '*') {
            /* wildcard at beginning of entry */

            if ((addr && strnicmp(hostip + hostip_len - (e - s - 1),
                                  exclude_list + s + 1, e - s - 1) == 0) ||
                strnicmp(hostname + hostname_len - (e - s - 1),
                         exclude_list + s + 1, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else if (exclude_list[e-1] == '*') {
            /* wildcard at end of entry */

            if ((addr && strnicmp(hostip, exclude_list + s, e - s - 1) == 0) ||
                strnicmp(hostname, exclude_list + s, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else {
            /* no wildcard at either end, so let's try an absolute
             * match (ie. a specific IP)
             */

            if (addr && strnicmp(hostip, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
            if (strnicmp(hostname, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
        }

        s = e;

        /* Make sure we really have reached the next comma or end-of-string */
        while (exclude_list[s] &&
               !isspace((unsigned char)exclude_list[s]) &&
               exclude_list[s] != ',') s++;
    }

    /* no matches in the exclude list, so use the proxy */
    return true;
}